

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject_test_app.cpp
# Opt level: O1

void __thiscall Turtle::walk(Turtle *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  *(uint *)(strcmp + *(long *)(std::cout + -0x18)) =
       *(uint *)(strcmp + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] Called ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"walk",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void walk() { LOG_FUNCTION_CALL(); }